

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushFinishCase::iterate(FlushFinishCase *this)

{
  undefined8 *puVar1;
  deUint32 *pdVar2;
  float fVar3;
  TestLog *pTVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  deUint32 err;
  value_type *__val;
  undefined4 extraout_var;
  RenderTarget *pRVar8;
  deUint64 dVar9;
  deUint64 dVar10;
  ostream *poVar11;
  CalibrationFailedException *pCVar12;
  deUint64 dVar13;
  deUint64 dVar14;
  pointer value;
  MessageBuilder *pMVar15;
  TestError *this_00;
  LogNumber<float> *pLVar16;
  string *psVar17;
  int precision;
  long lVar18;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  char *pcVar19;
  int iVar20;
  pointer __n;
  pointer pSVar21;
  int ndx;
  ulong uVar22;
  deUint64 *pdVar23;
  char *pcVar24;
  int iVar25;
  pointer pSVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  LineParameters LVar30;
  LineParameters LVar31;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float local_6a8;
  float fStack_6a4;
  ulong local_698;
  allocator<char> local_684;
  allocator<char> local_683;
  allocator<char> local_682;
  allocator<char> local_681;
  allocator<char> local_680;
  allocator<char> local_67f;
  allocator<char> local_67e;
  allocator<char> local_67d;
  allocator<char> local_67c;
  allocator<char> local_67b;
  allocator<char> local_67a;
  allocator<char> local_679;
  undefined8 local_678;
  float fStack_670;
  float fStack_66c;
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  local_660;
  vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  sortedSamples;
  ScopedLogSection section;
  Random rnd;
  string local_430;
  string local_410;
  string local_3f0;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> readTimes;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> waitTimes;
  ScopedLogSection section_1;
  float fStack_334;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  LogNumber<float> local_210;
  ostringstream msg;
  
  local_660._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x640);
  local_660._M_impl.super__Vector_impl_data._M_finish =
       local_660._M_impl.super__Vector_impl_data._M_start + 0x32;
  (local_660._M_impl.super__Vector_impl_data._M_start)->waitTime = 0;
  (local_660._M_impl.super__Vector_impl_data._M_start)->readPixelsTime = 0;
  *(undefined8 *)local_660._M_impl.super__Vector_impl_data._M_start = 0;
  (local_660._M_impl.super__Vector_impl_data._M_start)->submitTime = 0;
  for (lVar18 = 0x20; lVar18 != 0x640; lVar18 = lVar18 + 0x20) {
    puVar1 = (undefined8 *)
             ((long)&(local_660._M_impl.super__Vector_impl_data._M_start)->numDrawCalls + lVar18);
    uVar5 = *(undefined8 *)local_660._M_impl.super__Vector_impl_data._M_start;
    dVar9 = (local_660._M_impl.super__Vector_impl_data._M_start)->submitTime;
    dVar10 = (local_660._M_impl.super__Vector_impl_data._M_start)->readPixelsTime;
    puVar1[2] = (local_660._M_impl.super__Vector_impl_data._M_start)->waitTime;
    puVar1[3] = dVar10;
    *puVar1 = uVar5;
    puVar1[1] = dVar9;
  }
  local_660._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_660._M_impl.super__Vector_impl_data._M_finish;
  tcu::warmupCPU();
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var,iVar6);
  iVar7 = (**(code **)(lVar18 + 0x780))((this->m_program->m_program).m_program);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar8->m_width;
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (iVar7 < 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
               ,0xfb);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar25 = pRVar8->m_height;
  if (0xff < iVar25) {
    iVar25 = 0x100;
  }
  iVar20 = 0x100;
  if (iVar6 < 0x100) {
    iVar20 = iVar6;
  }
  (**(code **)(lVar18 + 0x1a00))(0,0,iVar20,iVar25);
  (**(code **)(lVar18 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar18 + 0x610))(iVar7);
  (**(code **)(lVar18 + 0x19f0))
            (iVar7,2,0x1406,0,0,
             Functional::(anonymous_namespace)::FlushFinishCase::setupRenderState()::s_positions);
  (**(code **)(lVar18 + 0x5e0))(0xbe2);
  (**(code **)(lVar18 + 0x120))(1,1);
  (**(code **)(lVar18 + 0x100))(0x8006);
  err = (**(code **)(lVar18 + 0x800))();
  glu::checkError(err,"Failed to set up render state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
                  ,0x104);
  setShaderIterCount(this,1);
  render(this,1);
  readPixels(this);
  tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rnd,"CalibrationInfo",(allocator<char> *)&section_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sortedSamples,"Calibration info",(allocator<char> *)&local_210);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,(string *)&rnd,(string *)&sortedSamples);
  std::__cxx11::string::~string((string *)&sortedSamples);
  std::__cxx11::string::~string((string *)&rnd);
  rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pdVar2 = &rnd.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::operator<<((ostream *)pdVar2,"Calibrating shader iteration count, target duration = ");
  std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
  std::operator<<((ostream *)pdVar2," us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  uVar27 = 0;
  iVar6 = 1;
  iVar7 = 1;
  while( true ) {
    iVar25 = iVar6;
    setShaderIterCount(this,iVar25);
    render(this,1);
    dVar9 = deGetMicroseconds();
    readPixels(this);
    dVar10 = deGetMicroseconds();
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar2 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,"Duration with ");
    std::ostream::operator<<(pdVar2,iVar25);
    std::operator<<((ostream *)pdVar2," iterations = ");
    uVar22 = dVar10 - dVar9;
    std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
    std::operator<<((ostream *)pdVar2," us");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    if (0x5dc < uVar22) break;
    if (0x3ff < iVar25) goto LAB_01102358;
    uVar27 = uVar22;
    iVar6 = iVar25 * 2;
    iVar7 = iVar25;
  }
  if (1 < iVar25) {
    fVar34 = (float)(uVar22 - uVar27) / (float)(iVar25 - iVar7);
    fVar34 = floorf((1500.0 - ((float)(long)uVar27 - (float)iVar7 * fVar34)) / fVar34);
    iVar25 = (int)fVar34;
    if (0x3ff < iVar25) {
      iVar25 = 0x400;
    }
    if (iVar25 < 2) {
      iVar25 = 1;
    }
  }
LAB_01102358:
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sortedSamples,"ShaderIterCount",(allocator<char> *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Shader iteration count",(allocator<char> *)&local_410);
  pLVar16 = &local_210;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pLVar16,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&local_430);
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)&rnd,(string *)&sortedSamples,(string *)&section_1,&pLVar16->m_name,
             QP_KEY_TAG_NONE,(long)iVar25);
  tcu::LogNumber<long>::write((LogNumber<long> *)&rnd,(int)pTVar4,__buf,(size_t)pLVar16);
  tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&rnd);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&sortedSamples);
  rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pdVar2 = &rnd.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::operator<<((ostream *)pdVar2,"Calibrating maximum draw call count, target duration = ");
  std::ostream::operator<<(pdVar2,150000);
  std::operator<<((ostream *)&rnd.m_rnd.z," us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd.m_rnd.z);
  setShaderIterCount(this,iVar25);
  local_698 = 0;
  iVar6 = 1;
  iVar7 = 1;
  while( true ) {
    iVar20 = iVar6;
    render(this,iVar20);
    dVar9 = deGetMicroseconds();
    readPixels(this);
    dVar10 = deGetMicroseconds();
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar2 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,"Duration with ");
    std::ostream::operator<<(pdVar2,iVar20);
    std::operator<<((ostream *)pdVar2," draw calls = ");
    uVar27 = dVar10 - dVar9;
    std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
    std::operator<<((ostream *)pdVar2," us");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    if (150000 < uVar27) break;
    if (0xfffff < iVar20) goto LAB_011025ea;
    local_698 = uVar27;
    iVar6 = iVar20 * 2;
    iVar7 = iVar20;
  }
  if (1 < iVar20) {
    fVar34 = (float)(uVar27 - local_698) / (float)(iVar20 - iVar7);
    fVar34 = floorf((150000.0 - ((float)(long)local_698 - (float)iVar7 * fVar34)) / fVar34);
    iVar20 = (int)fVar34;
    if (0xfffff < iVar20) {
      iVar20 = 0x100000;
    }
    if (iVar20 < 2) {
      iVar20 = 1;
    }
  }
LAB_011025ea:
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sortedSamples,"MaxDrawCalls",(allocator<char> *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Maximum number of draw calls",(allocator<char> *)&local_410);
  pLVar16 = &local_210;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pLVar16,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&local_430);
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)&rnd,(string *)&sortedSamples,(string *)&section_1,&pLVar16->m_name,
             QP_KEY_TAG_NONE,(long)iVar20);
  tcu::LogNumber<long>::write((LogNumber<long> *)&rnd,(int)pTVar4,__buf_00,(size_t)pLVar16);
  tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&rnd);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&sortedSamples);
  if (iVar20 < 10) {
    pCVar12 = (CalibrationFailedException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rnd,"Calibration failed, maximum draw call count is too low",
               (allocator<char> *)&sortedSamples);
    CalibrationFailedException::CalibrationFailedException(pCVar12,(string *)&rnd);
    __cxa_throw(pCVar12,&Functional::(anonymous_namespace)::CalibrationFailedException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  setShaderIterCount(this,iVar25);
  iVar6 = 4;
  while (iVar6 = iVar6 + -1, iVar6 != 0) {
    render(this,iVar20);
    dVar9 = deGetMicroseconds();
    readPixels(this);
    dVar10 = deGetMicroseconds();
    lVar18 = dVar10 - dVar9;
    auVar33._8_4_ = (int)((ulong)lVar18 >> 0x20);
    auVar33._0_8_ = lVar18;
    auVar33._12_4_ = 0x45300000;
    fVar34 = (float)(((auVar33._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0)) / 150000.0) +
             -1.0;
    if ((fVar34 < -0.1) || (0.1 <= fVar34)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar11 = std::operator<<(&msg.super_basic_ostream<char,_std::char_traits<char>_>,
                                "ERROR: Unstable performance, got ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11," us read time, ");
      de::floatToString_abi_cxx11_((string *)&rnd,(de *)&DAT_00000001,fVar34 * 100.0,precision);
      poVar11 = std::operator<<(poVar11,(string *)&rnd);
      poVar11 = std::operator<<(poVar11,"% diff to estimated ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,150000);
      std::operator<<(poVar11," us");
      std::__cxx11::string::~string((string *)&rnd);
      pCVar12 = (CalibrationFailedException *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      CalibrationFailedException::CalibrationFailedException(pCVar12,(string *)&rnd);
      __cxa_throw(pCVar12,&Functional::(anonymous_namespace)::CalibrationFailedException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
  }
  deRandom_init(&rnd.m_rnd,0x7b);
  setShaderIterCount(this,iVar25);
  pSVar26 = local_660._M_impl.super__Vector_impl_data._M_finish;
  __n = (pointer)((long)local_660._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_660._M_impl.super__Vector_impl_data._M_start);
  lVar18 = (long)__n >> 5;
  local_678 = local_660._M_impl.super__Vector_impl_data._M_start;
  pdVar23 = &(local_660._M_impl.super__Vector_impl_data._M_start)->readPixelsTime;
  while (bVar28 = lVar18 != 0, lVar18 = lVar18 + -1, bVar28) {
    iVar6 = de::Random::getInt(&rnd,1,iVar20);
    dVar9 = deGetMicroseconds();
    render(this,iVar6);
    dVar10 = deGetMicroseconds();
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    dVar13 = deGetMicroseconds();
    readPixels(this);
    dVar14 = deGetMicroseconds();
    ((Sample *)(pdVar23 + -3))->numDrawCalls = iVar6;
    pdVar23[-2] = dVar10 - dVar9;
    pdVar23[-1] = dVar13 - dVar10;
    *pdVar23 = dVar14 - dVar13;
    tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    pdVar23 = pdVar23 + 4;
  }
  getPointsFromSamples
            (&waitTimes,
             (vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              *)&local_660,0x10);
  getPointsFromSamples
            (&readTimes,
             (vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              *)&local_660,0x18);
  LVar30 = deqp::gls::theilSenLinearRegression(&waitTimes);
  LVar31 = deqp::gls::theilSenLinearRegression(&readTimes);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rnd,"Samples",(allocator<char> *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sortedSamples,"Samples",(allocator<char> *)&section);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar4,(string *)&rnd,(string *)&sortedSamples)
  ;
  std::__cxx11::string::~string((string *)&sortedSamples);
  std::__cxx11::string::~string((string *)&rnd);
  sortedSamples.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sortedSamples.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sortedSamples.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((pointer)0x7fffffffffffffe0 < __n) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  if (pSVar26 == local_678) {
    value = (pointer)0x0;
    pSVar26 = __n;
    sortedSamples.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = __n;
    sortedSamples.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __n;
  }
  else {
    value = (pointer)operator_new((ulong)__n);
    pSVar26 = (pointer)((long)value + (long)__n);
    sortedSamples.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = value;
    sortedSamples.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar26;
    memcpy(value,local_678,(size_t)__n);
    lVar18 = 0x3f;
    if ((ulong)__n >> 5 != 0) {
      for (; ((ulong)__n >> 5) >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    sortedSamples.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar26;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
              (value,pSVar26,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
    if (__n < (pointer)0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                (value,pSVar26);
    }
    else {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                (value,value + 0x10);
      for (pSVar21 = (pointer)0x200; __n != pSVar21; pSVar21 = pSVar21 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Val_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                  ((long)&pSVar21->numDrawCalls + (long)&value->numDrawCalls);
      }
    }
  }
  fStack_324 = LVar30.coefficient;
  fStack_320 = (float)extraout_XMM0_Qb;
  fStack_31c = (float)((ulong)extraout_XMM0_Qb >> 0x20);
  fVar34 = (float)iVar20;
  fStack_334 = LVar31.coefficient;
  auVar32._0_4_ = fVar34 * fStack_324;
  auVar32._4_4_ = fVar34 * fStack_334;
  auVar32._8_4_ = fVar34 * fStack_320;
  auVar32._12_4_ = fVar34 * fStack_31c;
  auVar33 = divps(auVar32,_DAT_018654b0);
  local_678 = (pointer)CONCAT44(fStack_334,fStack_334);
  fStack_670 = fStack_334;
  fStack_66c = fStack_334;
  pdVar2 = &rnd.m_rnd.z;
  for (; value != pSVar26; value = value + 1) {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    pMVar15 = tcu::MessageBuilder::operator<<((MessageBuilder *)&rnd,&value->numDrawCalls);
    std::operator<<(&(pMVar15->m_str).super_basic_ostream<char,_std::char_traits<char>_>," calls:\t"
                   );
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&value->submitTime);
    std::operator<<(&(pMVar15->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " us submit,\t");
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&value->waitTime);
    std::operator<<(&(pMVar15->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " us wait,\t");
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&value->readPixelsTime);
    std::operator<<(&(pMVar15->m_str).super_basic_ostream<char,_std::char_traits<char>_>," us read")
    ;
    tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    pSVar26 = sortedSamples.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ::~_Vector_base(&sortedSamples.
                   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                 );
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"WaitCoefficient",&local_679);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Wait coefficient",&local_67a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,glcts::fixed_sample_locations_values + 1,&local_67b);
  psVar17 = &local_410;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&rnd,(string *)&section,&local_3f0,psVar17,QP_KEY_TAG_NONE,
             fStack_324);
  iVar6 = (int)pTVar4;
  tcu::LogNumber<float>::write((LogNumber<float> *)&rnd,iVar6,__buf_01,(size_t)psVar17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"ReadCoefficient",&local_67c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"Read coefficient",&local_67d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,glcts::fixed_sample_locations_values + 1,&local_67e);
  psVar17 = &local_250;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&sortedSamples,&local_430,&local_230,psVar17,QP_KEY_TAG_NONE,
             (float)local_678);
  tcu::LogNumber<float>::write((LogNumber<float> *)&sortedSamples,iVar6,__buf_02,(size_t)psVar17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"NormalizedWaitCoefficient",&local_67f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"Normalized wait coefficient",&local_680);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,glcts::fixed_sample_locations_values + 1,&local_681);
  psVar17 = &local_2b0;
  local_6a8 = auVar33._0_4_;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&section_1,&local_270,&local_290,psVar17,QP_KEY_TAG_NONE,local_6a8)
  ;
  tcu::LogNumber<float>::write((LogNumber<float> *)&section_1,iVar6,__buf_03,(size_t)psVar17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"NormalizedReadCoefficient",&local_682);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"Normalized read coefficient",&local_683);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,glcts::fixed_sample_locations_values + 1,&local_684);
  fStack_6a4 = auVar33._4_4_;
  psVar17 = &local_310;
  local_678 = (pointer)CONCAT44(fStack_6a4,fStack_6a4);
  fStack_670 = fStack_6a4;
  fStack_66c = fStack_6a4;
  tcu::LogNumber<float>::LogNumber
            (&local_210,&local_2d0,&local_2f0,psVar17,QP_KEY_TAG_NONE,fStack_6a4);
  tcu::LogNumber<float>::write(&local_210,iVar6,__buf_04,(size_t)psVar17);
  tcu::LogNumber<float>::~LogNumber(&local_210);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&section_1);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&sortedSamples);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_430);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&rnd);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&section);
  if ((0.5 < local_6a8) || (local_6a8 < 0.1)) {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar2 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,"Wait time is");
    pcVar19 = " NOT";
    if (0.5 < local_6a8) {
      pcVar19 = glcts::fixed_sample_locations_values + 1;
    }
    std::operator<<((ostream *)pdVar2,pcVar19);
    std::operator<<((ostream *)pdVar2," correlated to rendering workload size.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar2 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,
                    "Warning: Wait time correlation to rendering workload size is unclear.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd.m_rnd.z);
  if ((0.5 < (float)local_678) || (fStack_6a4 < 0.1)) {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar2 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,"Read time is");
    pcVar19 = " NOT";
    if (0.5 < (float)local_678) {
      pcVar19 = glcts::fixed_sample_locations_values + 1;
    }
    std::operator<<((ostream *)pdVar2,pcVar19);
    std::operator<<((ostream *)pdVar2," correlated to rendering workload size.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar2 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,
                    "Warning: Read time correlation to rendering workload size is unclear.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd.m_rnd.z);
  bVar28 = true;
  iVar6 = 0;
  pdVar2 = &rnd.m_rnd.z;
  do {
    if (iVar6 == 2) {
      pcVar19 = "Suspicious performance behavior";
      if (bVar28) {
        pcVar19 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar28 & QP_TEST_RESULT_FAIL,pcVar19);
      std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
      ~_Vector_base(&readTimes.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
      ~_Vector_base(&waitTimes.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   );
      std::
      _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
      ::~_Vector_base(&local_660);
      return STOP;
    }
    bVar29 = iVar6 != 0;
    fVar34 = local_6a8;
    if (bVar29) {
      fVar34 = (float)local_678;
    }
    pcVar19 = "render and read";
    if (!bVar29) {
      pcVar19 = "Finish and wait";
    }
    fVar3 = (&this->m_waitThreshold)[(ulong)bVar29 * 2];
    if ((&this->m_waitBehavior)[(ulong)bVar29 * 2] == EXPECT_COEF_GREATER_THAN) {
      pcVar24 = "greater than";
      if (fVar34 <= fVar3) {
LAB_0110348c:
        rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
        std::operator<<((ostream *)pdVar2,"ERROR: Expected ");
        std::operator<<((ostream *)pdVar2,pcVar19 + 0xb);
        std::operator<<((ostream *)pdVar2," coefficient to be ");
        std::operator<<((ostream *)pdVar2,pcVar24);
        std::operator<<((ostream *)pdVar2," ");
        std::ostream::operator<<(pdVar2,fVar3);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
        bVar28 = false;
      }
    }
    else {
      pcVar24 = (char *)0x0;
      if (((&this->m_waitBehavior)[(ulong)bVar29 * 2] != EXPECT_COEF_LESS_THAN) ||
         (pcVar24 = "less than", fVar3 <= fVar34)) goto LAB_0110348c;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

FlushFinishCase::IterateResult FlushFinishCase::iterate (void)
{
	vector<Sample>		samples		(NUM_SAMPLES);
	CalibrationParams	params;

	tcu::warmupCPU();

	setupRenderState();

	// Do one full render cycle.
	{
		setShaderIterCount(1);
		render(1);
		readPixels();
	}

	// Calibrate.
	for (int calibrationRoundNdx = 0; /* until done */; calibrationRoundNdx++)
	{
		try
		{
			m_testCtx.touchWatchdog();
			params = calibrate();
			verifyCalibration(params);
			break;
		}
		catch (const CalibrationFailedException& e)
		{
			m_testCtx.getLog() << e;

			if (calibrationRoundNdx < MAX_CALIBRATION_ATTEMPTS)
			{
				m_testCtx.getLog() << TestLog::Message
								   << "Retrying calibration (" << (calibrationRoundNdx+1) << " / " << (int)MAX_CALIBRATION_ATTEMPTS << ")"
								   << TestLog::EndMessage;
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, e.what());
				return STOP;
			}
		}
	}

	// Do measurement.
	{
		de::Random	rnd		(123);

		setShaderIterCount(params.numItersInShader);

		for (size_t ndx = 0; ndx < samples.size(); ndx++)
		{
			const int		drawCallCount	= rnd.getInt(1, params.maxDrawCalls);
			const deUint64	submitStartTime	= deGetMicroseconds();
			deUint64		waitStartTime;
			deUint64		readStartTime;
			deUint64		readFinishTime;

			render(drawCallCount);

			waitStartTime = deGetMicroseconds();
			waitForGL();

			readStartTime = deGetMicroseconds();
			readPixels();
			readFinishTime = deGetMicroseconds();

			samples[ndx].numDrawCalls	= drawCallCount;
			samples[ndx].submitTime		= waitStartTime-submitStartTime;
			samples[ndx].waitTime		= readStartTime-waitStartTime;
			samples[ndx].readPixelsTime	= readFinishTime-readStartTime;

			m_testCtx.touchWatchdog();
		}
	}

	// Analyze - sets test case result.
	analyzeResults(samples, params);

	return STOP;
}